

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_callback_helper.h
# Opt level: O2

VoidConstPtr __thiscall
miniros::
SubscriptionCallbackHelperT<const_std::shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>_>_&,_void>
::deserialize(SubscriptionCallbackHelperT<const_std::shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>_>_&,_void>
              *this,SubscriptionCallbackHelperDeserializeParams *params)

{
  Level level;
  void *logger_handle;
  long lVar1;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VoidConstPtr VVar2;
  NonConstTypePtr msg;
  PreDeserializeParams<rosgraph_msgs::Clock_<std::allocator<void>_>_> predes_params;
  IStream stream;
  
  std::function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()>::operator()
            ((function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()> *)&msg);
  if (msg.
      super___shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (deserialize::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&predes_params,"miniros.init",(allocator<char> *)&stream);
      console::initializeLogLocation(&deserialize::loc,(string *)&predes_params,Debug);
      std::__cxx11::string::~string((string *)&predes_params);
    }
    if (deserialize::loc.level_ != Debug) {
      console::setLogLocationLevel(&deserialize::loc,Debug);
      console::checkLogLocationEnabled(&deserialize::loc);
    }
    logger_handle = deserialize::loc.logger_;
    level = deserialize::loc.level_;
    if (deserialize::loc.logger_enabled_ == true) {
      lVar1 = (**(code **)(params->buffer + 0x20))();
      console::print((FilterBase *)0x0,logger_handle,level,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/include/miniros/transport/subscription_callback_helper.h"
                     ,0x77,
                     "virtual VoidConstPtr miniros::SubscriptionCallbackHelperT<const std::shared_ptr<const rosgraph_msgs::Clock_<std::allocator<void>>> &>::deserialize(const SubscriptionCallbackHelperDeserializeParams &) [P = const std::shared_ptr<const rosgraph_msgs::Clock_<std::allocator<void>>> &, Enabled = void]"
                     ,"Allocation failed for message of type [%s]",
                     *(char **)(lVar1 + 8) + (**(char **)(lVar1 + 8) == '*'));
    }
    (this->super_SubscriptionCallbackHelper)._vptr_SubscriptionCallbackHelper = (_func_int **)0x0;
    *(undefined8 *)&(this->callback_).super__Function_base._M_functor = 0;
  }
  else {
    predes_params.connection_header.
    super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    predes_params.connection_header.
    super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    predes_params.message.
    super___shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    predes_params.message.
    super___shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>::
    operator=((__shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
               *)&predes_params,
              &msg.
               super___shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
             );
    std::
    __shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&predes_params.connection_header.
                 super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ,(__shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)(in_RDX + 2));
    stream.super_Stream.data_ = (uint8_t *)*in_RDX;
    stream.super_Stream.end_ = stream.super_Stream.data_ + *(uint *)(in_RDX + 1);
    serialization::Serializer<miniros::Time>::read<miniros::serialization::IStream>
              (&stream,&(msg.
                         super___shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->clock);
    std::__shared_ptr<void_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>>,void>
              ((__shared_ptr<void_const,(__gnu_cxx::_Lock_policy)2> *)this,
               &msg.
                super___shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              );
    serialization::PreDeserializeParams<rosgraph_msgs::Clock_<std::allocator<void>_>_>::
    ~PreDeserializeParams(&predes_params);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&msg.
              super___shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  VVar2.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar2.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (VoidConstPtr)VVar2.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual VoidConstPtr deserialize(const SubscriptionCallbackHelperDeserializeParams& params)
  {
    namespace ser = serialization;

    NonConstTypePtr msg = create_();

    if (!msg)
    {
      MINIROS_DEBUG("Allocation failed for message of type [%s]", getTypeInfo().name());
      return VoidConstPtr();
    }

    ser::PreDeserializeParams<NonConstType> predes_params;
    predes_params.message = msg;
    predes_params.connection_header = params.connection_header;
    ser::PreDeserialize<NonConstType>::notify(predes_params);

    ser::IStream stream(params.buffer, params.length);
    ser::deserialize(stream, *msg);

    return VoidConstPtr(msg);
  }